

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.h
# Opt level: O2

Optimizer *
google::protobuf::Arena::CreateMessageInternal<CoreML::Specification::Optimizer>(Arena *arena)

{
  Optimizer *pOVar1;
  
  if (arena != (Arena *)0x0) {
    pOVar1 = DoCreateMessage<CoreML::Specification::Optimizer>(arena);
    return pOVar1;
  }
  pOVar1 = (Optimizer *)operator_new(0x20);
  CoreML::Specification::Optimizer::Optimizer(pOVar1,(Arena *)0x0,false);
  return pOVar1;
}

Assistant:

PROTOBUF_NDEBUG_INLINE static T* CreateMessageInternal(Arena* arena) {
    static_assert(
        InternalHelper<T>::is_arena_constructable::value,
        "CreateMessage can only construct types that are ArenaConstructable");
    if (arena == NULL) {
      // Generated arena constructor T(Arena*) is protected. Call via
      // InternalHelper.
      return InternalHelper<T>::New();
    } else {
      return arena->DoCreateMessage<T>();
    }
  }